

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_envelope.cxx
# Opt level: O2

void __thiscall xray_re::xr_envelope::insert_key(xr_envelope *this,xr_key *key)

{
  float fVar1;
  xr_key **ppxVar2;
  xr_key **ppxVar3;
  const_iterator __position;
  xr_key *local_8;
  
  ppxVar2 = (this->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppxVar3 = (this->m_keys).super__Vector_base<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_8 = key;
  if (ppxVar2 == ppxVar3) {
    std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::push_back
              (&this->m_keys,&local_8);
  }
  else {
    if ((long)ppxVar3 - (long)ppxVar2 == 8) {
      __position._M_current = ppxVar3;
      if (key->time <= (*ppxVar2)->time && (*ppxVar2)->time != key->time) {
        __position._M_current = ppxVar2;
      }
    }
    else {
      fVar1 = key->time;
      __position._M_current = ppxVar2;
      if (((*ppxVar2)->time <= fVar1) &&
         (__position._M_current = ppxVar3, fVar1 < ppxVar3[-1]->time || fVar1 == ppxVar3[-1]->time))
      {
        __position._M_current = ppxVar2 + -1;
        do {
          ppxVar2 = __position._M_current + 2;
          __position._M_current = __position._M_current + 1;
        } while ((*ppxVar2)->time <= fVar1 && fVar1 != (*ppxVar2)->time);
      }
    }
    std::vector<xray_re::xr_key_*,_std::allocator<xray_re::xr_key_*>_>::insert
              (&this->m_keys,__position,&local_8);
  }
  return;
}

Assistant:

void xr_envelope::insert_key(xr_key* key)
{
	if (m_keys.empty()) {
		m_keys.push_back(key);
	} else if (m_keys.size() == 1) {
		m_keys.insert((key->time < m_keys.front()->time) ? m_keys.begin() : m_keys.end(), key);
	} else {
		xr_key* skey = m_keys.front();
		xr_key* ekey = m_keys.back();

		xr_key_vec_it it;
		float time = key->time;
		if (time < skey->time) {
			it = m_keys.begin();
		} else if (ekey->time < time) {
			it = m_keys.end();
		} else {
			for (it = m_keys.begin() + 1; (*it)->time < time; ++it) {}
			--it;
		}
		m_keys.insert(it, key);
	}
}